

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O2

MainFunc __thiscall capnp::compiler::CompilerMain::getEvalMain(CompilerMain *this)

{
  StringPtr extendedDescription;
  StringPtr helpText;
  MainBuilder *pMVar1;
  Iface *extraout_RDX;
  CompilerMain *in_RSI;
  StringPtr version;
  MainFunc MVar2;
  initializer_list<kj::MainBuilder::OptionName> names;
  initializer_list<kj::MainBuilder::OptionName> names_00;
  initializer_list<kj::MainBuilder::OptionName> names_01;
  initializer_list<kj::MainBuilder::OptionName> names_02;
  initializer_list<kj::MainBuilder::OptionName> names_03;
  StringPtr title;
  StringPtr title_00;
  StringPtr briefDescription;
  StringPtr argumentTitle;
  StringPtr helpText_00;
  StringPtr helpText_01;
  StringPtr helpText_02;
  StringPtr helpText_03;
  MainBuilder builder;
  Own<kj::Function<kj::MainBuilder::Validity_(kj::StringPtr)>::Iface,_std::nullptr_t> local_198;
  Own<kj::Function<kj::MainBuilder::Validity_(kj::StringPtr)>::Iface,_std::nullptr_t> local_188;
  Own<kj::Function<kj::MainBuilder::Validity_()>::Iface,_std::nullptr_t> local_178;
  Own<kj::Function<kj::MainBuilder::Validity_()>::Iface,_std::nullptr_t> local_168;
  Own<kj::Function<kj::MainBuilder::Validity_()>::Iface,_std::nullptr_t> local_158;
  Own<kj::Function<kj::MainBuilder::Validity_()>::Iface,_std::nullptr_t> local_148;
  Own<kj::Function<kj::MainBuilder::Validity_(kj::StringPtr)>::Iface,_std::nullptr_t> local_138;
  OptionName local_128;
  OptionName local_118;
  char *local_108;
  undefined8 uStack_100;
  char *local_f8;
  undefined8 uStack_f0;
  OptionName local_e8;
  undefined1 local_d8;
  char *local_d0;
  OptionName local_c8;
  undefined1 local_b8;
  char *local_b0;
  OptionName local_a8;
  undefined1 local_98;
  char *local_90;
  BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:294:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:294:33)>
  local_88;
  BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:293:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:293:40)>
  local_78;
  BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:289:34),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:289:34)>
  local_68;
  BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:287:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:287:40)>
  local_58;
  BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:285:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:285:33)>
  local_48;
  BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:283:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:283:40)>
  local_38;
  BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:280:47),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:280:47)>
  local_28;
  
  in_RSI->annotationFlag = DROP_ANNOTATIONS;
  in_RSI->compileEagerness = 1;
  in_RSI->convertTo = TEXT;
  ModuleLoader::setFileIdsRequired(&in_RSI->loader,false);
  local_f8 = 
  "By default the value is written in text format and can have any type.  The -b, -p, and --flat flags specify binary output, in which case the const must be of struct type."
  ;
  uStack_f0 = 0xab;
  extendedDescription.content.size_ = 0xab;
  extendedDescription.content.ptr =
       "By default the value is written in text format and can have any type.  The -b, -p, and --flat flags specify binary output, in which case the const must be of struct type."
  ;
  version.content.size_ = 0x1c;
  version.content.ptr = "Cap\'n Proto version 2.0-dev";
  briefDescription.content.size_ = 0x2ee;
  briefDescription.content.ptr =
       "Prints (or encodes) the value of <name>, which must be defined in <schema-file>.  <name> must refer to a const declaration, a field of a struct type (prints the default value), or a field or list element nested within some other value.  Examples:\n    capnp eval myschema.capnp MyType.someField\n    capnp eval myschema.capnp someConstant\n    capnp eval myschema.capnp someConstant.someField\n    capnp eval myschema.capnp someConstant.someList[4]\n    capnp eval myschema.capnp someConstant.someList[4].anotherField[1][2][3]\nSince consts can have complex struct types, and since you can define a const using import and variable substitution, this can be a convenient way to write text-format config files which are compiled to binary before deployment."
  ;
  kj::MainBuilder::MainBuilder
            (&builder,in_RSI->context,version,briefDescription,extendedDescription);
  addGlobalOptions(in_RSI,&builder);
  local_a8.isLong = false;
  local_a8.field_1.shortName = 'o';
  local_98 = 1;
  local_90 = "output";
  kj::Function<kj::MainBuilder::Validity(kj::StringPtr)>::
  Function<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getEvalMain()::_lambda(auto:1&,(auto:2&&)___)_1_,capnp::compiler::CompilerMain::getEvalMain()::_lambda(auto:1&,(auto:2&&)___)_2_>>
            ((Function<kj::MainBuilder::Validity(kj::StringPtr)> *)&local_138,&local_28);
  local_108 = 
  "Encode the output in the given format. See `capnp help convert` for a list of formats. Defaults to \"text\"."
  ;
  uStack_100 = 0x6b;
  helpText.content.size_ = 0x6b;
  helpText.content.ptr =
       "Encode the output in the given format. See `capnp help convert` for a list of formats. Defaults to \"text\"."
  ;
  names._M_len = 2;
  names._M_array = &local_a8;
  argumentTitle.content.size_ = 9;
  argumentTitle.content.ptr = "<format>";
  pMVar1 = kj::MainBuilder::addOptionWithArg
                     (&builder,names,
                      (Function<kj::MainBuilder::Validity_(kj::StringPtr)> *)&local_138,
                      argumentTitle,helpText);
  local_c8.isLong = false;
  local_c8.field_1.shortName = 'b';
  local_b8 = 1;
  local_b0 = "binary";
  kj::Function<kj::MainBuilder::Validity()>::
  Function<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getEvalMain()::_lambda(auto:1&,(auto:2&&)___)_3_,capnp::compiler::CompilerMain::getEvalMain()::_lambda(auto:1&,(auto:2&&)___)_4_>>
            ((Function<kj::MainBuilder::Validity()> *)&local_148,&local_38);
  names_00._M_len = 2;
  names_00._M_array = &local_c8;
  helpText_00.content.size_ = 0x11;
  helpText_00.content.ptr = "same as -obinary";
  pMVar1 = kj::MainBuilder::addOption
                     (pMVar1,names_00,(Function<kj::MainBuilder::Validity_()> *)&local_148,
                      helpText_00);
  local_118.isLong = true;
  local_118.field_1.longName = "flat";
  kj::Function<kj::MainBuilder::Validity()>::
  Function<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getEvalMain()::_lambda(auto:1&,(auto:2&&)___)_5_,capnp::compiler::CompilerMain::getEvalMain()::_lambda(auto:1&,(auto:2&&)___)_6_>>
            ((Function<kj::MainBuilder::Validity()> *)&local_158,&local_48);
  names_01._M_len = 1;
  names_01._M_array = &local_118;
  helpText_01.content.size_ = 0xf;
  helpText_01.content.ptr = "same as -oflat";
  pMVar1 = kj::MainBuilder::addOption
                     (pMVar1,names_01,(Function<kj::MainBuilder::Validity_()> *)&local_158,
                      helpText_01);
  local_e8.isLong = false;
  local_e8.field_1.shortName = 'p';
  local_d8 = 1;
  local_d0 = "packed";
  kj::Function<kj::MainBuilder::Validity()>::
  Function<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getEvalMain()::_lambda(auto:1&,(auto:2&&)___)_7_,capnp::compiler::CompilerMain::getEvalMain()::_lambda(auto:1&,(auto:2&&)___)_8_>>
            ((Function<kj::MainBuilder::Validity()> *)&local_168,&local_58);
  names_02._M_len = 2;
  names_02._M_array = &local_e8;
  helpText_02.content.size_ = 0x11;
  helpText_02.content.ptr = "same as -opacked";
  pMVar1 = kj::MainBuilder::addOption
                     (pMVar1,names_02,(Function<kj::MainBuilder::Validity_()> *)&local_168,
                      helpText_02);
  local_128.isLong = true;
  local_128.field_1.longName = "short";
  kj::Function<kj::MainBuilder::Validity()>::
  Function<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getEvalMain()::_lambda(auto:1&,(auto:2&&)___)_9_,capnp::compiler::CompilerMain::getEvalMain()::_lambda(auto:1&,(auto:2&&)___)_10_>>
            ((Function<kj::MainBuilder::Validity()> *)&local_178,&local_68);
  names_03._M_len = 1;
  names_03._M_array = &local_128;
  helpText_03.content.size_ = 0xa0;
  helpText_03.content.ptr =
       "If output format is text or JSON, write in short (non-pretty) format. The message will be printed on one line, without using whitespace to improve readability."
  ;
  pMVar1 = kj::MainBuilder::addOption
                     (pMVar1,names_03,(Function<kj::MainBuilder::Validity_()> *)&local_178,
                      helpText_03);
  kj::Function<kj::MainBuilder::Validity(kj::StringPtr)>::
  Function<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getEvalMain()::_lambda(auto:1&,(auto:2&&)___)_11_,capnp::compiler::CompilerMain::getEvalMain()::_lambda(auto:1&,(auto:2&&)___)_12_>>
            ((Function<kj::MainBuilder::Validity(kj::StringPtr)> *)&local_188,&local_78);
  title.content.size_ = 0xe;
  title.content.ptr = "<schema-file>";
  pMVar1 = kj::MainBuilder::expectArg
                     (pMVar1,title,(Function<kj::MainBuilder::Validity_(kj::StringPtr)> *)&local_188
                     );
  kj::Function<kj::MainBuilder::Validity(kj::StringPtr)>::
  Function<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getEvalMain()::_lambda(auto:1&,(auto:2&&)___)_13_,capnp::compiler::CompilerMain::getEvalMain()::_lambda(auto:1&,(auto:2&&)___)_14_>>
            ((Function<kj::MainBuilder::Validity(kj::StringPtr)> *)&local_198,&local_88);
  title_00.content.size_ = 7;
  title_00.content.ptr = "<name>";
  kj::MainBuilder::expectArg
            (pMVar1,title_00,(Function<kj::MainBuilder::Validity_(kj::StringPtr)> *)&local_198);
  kj::Own<kj::Function<kj::MainBuilder::Validity_(kj::StringPtr)>::Iface,_std::nullptr_t>::dispose
            (&local_198);
  kj::Own<kj::Function<kj::MainBuilder::Validity_(kj::StringPtr)>::Iface,_std::nullptr_t>::dispose
            (&local_188);
  kj::Own<kj::Function<kj::MainBuilder::Validity_()>::Iface,_std::nullptr_t>::dispose(&local_178);
  kj::Own<kj::Function<kj::MainBuilder::Validity_()>::Iface,_std::nullptr_t>::dispose(&local_168);
  kj::Own<kj::Function<kj::MainBuilder::Validity_()>::Iface,_std::nullptr_t>::dispose(&local_158);
  kj::Own<kj::Function<kj::MainBuilder::Validity_()>::Iface,_std::nullptr_t>::dispose(&local_148);
  kj::Own<kj::Function<kj::MainBuilder::Validity_(kj::StringPtr)>::Iface,_std::nullptr_t>::dispose
            (&local_138);
  kj::MainBuilder::build((MainBuilder *)this);
  kj::MainBuilder::~MainBuilder(&builder);
  MVar2.impl.ptr = extraout_RDX;
  MVar2.impl.disposer = (Disposer *)this;
  return (MainFunc)MVar2.impl;
}

Assistant:

kj::MainFunc getEvalMain() {
    // Only parse the schemas we actually need for decoding.
    compileEagerness = Compiler::NODE;

    // Drop annotations since we don't need them.  This avoids importing files like c++.capnp.
    annotationFlag = Compiler::DROP_ANNOTATIONS;

    // Default convert to text unless -o is given.
    convertTo = Format::TEXT;

    // When using `capnp eval`, type IDs don't really matter, because `eval` won't actually use
    // them for anything. When using Cap'n Proto an a config format -- the common use case for
    // `capnp eval` -- the exercise of adding a file ID to every file is pointless busy work. So,
    // we don't require it.
    loader.setFileIdsRequired(false);

    kj::MainBuilder builder(context, VERSION_STRING,
          "Prints (or encodes) the value of <name>, which must be defined in <schema-file>.  "
          "<name> must refer to a const declaration, a field of a struct type (prints the default "
          "value), or a field or list element nested within some other value.  Examples:\n"
          "    capnp eval myschema.capnp MyType.someField\n"
          "    capnp eval myschema.capnp someConstant\n"
          "    capnp eval myschema.capnp someConstant.someField\n"
          "    capnp eval myschema.capnp someConstant.someList[4]\n"
          "    capnp eval myschema.capnp someConstant.someList[4].anotherField[1][2][3]\n"
          "Since consts can have complex struct types, and since you can define a const using "
          "import and variable substitution, this can be a convenient way to write text-format "
          "config files which are compiled to binary before deployment.",

          "By default the value is written in text format and can have any type.  The -b, -p, "
          "and --flat flags specify binary output, in which case the const must be of struct "
          "type.");
    addGlobalOptions(builder);
    builder.addOptionWithArg({'o', "output"}, KJ_BIND_METHOD(*this, setEvalOutputFormat),
                      "<format>", "Encode the output in the given format. See `capnp help convert` "
                      "for a list of formats. Defaults to \"text\".")
           .addOption({'b', "binary"}, KJ_BIND_METHOD(*this, codeBinary),
                      "same as -obinary")
           .addOption({"flat"}, KJ_BIND_METHOD(*this, codeFlat),
                      "same as -oflat")
           .addOption({'p', "packed"}, KJ_BIND_METHOD(*this, codePacked),
                      "same as -opacked")
           .addOption({"short"}, KJ_BIND_METHOD(*this, printShort),
                      "If output format is text or JSON, write in short (non-pretty) format. The "
                      "message will be printed on one line, without using whitespace to improve "
                      "readability.")
           .expectArg("<schema-file>", KJ_BIND_METHOD(*this, addSource))
           .expectArg("<name>", KJ_BIND_METHOD(*this, evalConst));
    return builder.build();
  }